

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::CreateProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  string *psVar1;
  string projectName;
  string outputDir;
  string sessionFilename;
  string filename;
  char local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&local_70,(string *)psVar1);
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_90,
             *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start);
  local_50._M_dataplus._M_p._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[5]>
            (&local_30,&local_70,(char *)&local_50,&local_90,(char (*) [5])".cbp");
  local_91 = '/';
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[8]>
            (&local_50,&local_70,&local_91,&local_90,(char (*) [8])".layout");
  CreateNewProjectFile(this,lgs,&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir = lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName = lgs[0]->GetProjectName();

  std::string filename = cmStrCat(outputDir, '/', projectName, ".cbp");
  std::string sessionFilename =
    cmStrCat(outputDir, '/', projectName, ".layout");

  this->CreateNewProjectFile(lgs, filename);
}